

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_lite.cc
# Opt level: O3

bool __thiscall
google::protobuf::MessageLite::SerializeToArray(MessageLite *this,void *data,int size)

{
  bool bVar1;
  
  bVar1 = SerializePartialToArray(this,data,size);
  return bVar1;
}

Assistant:

bool MessageLite::SerializeToArray(void* data, int size) const {
  GOOGLE_DCHECK(IsInitialized()) << InitializationErrorMessage("serialize", *this);
  return SerializePartialToArray(data, size);
}